

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> __thiscall
wallet::CWallet::GetSolvingProvider(CWallet *this,CScript *script,SignatureData *sigdata)

{
  long lVar1;
  long *plVar2;
  _func_int *p_Var3;
  long lVar4;
  int iVar5;
  const_iterator cVar6;
  LegacyScriptPubKeyMan *pLVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar6 = std::
          _Hashtable<CScript,_std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<CScript,_std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(script + 0xd),(key_type *)sigdata);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pLVar7 = GetLegacyScriptPubKeyMan((CWallet *)script);
    if ((pLVar7 == (LegacyScriptPubKeyMan *)0x0) ||
       (iVar5 = (*(pLVar7->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                          (pLVar7,sigdata), (char)iVar5 == '\0')) {
      (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (__uniq_ptr_data<SigningProvider,_std::default_delete<SigningProvider>,_true,_true>)
               (__uniq_ptr_data<SigningProvider,_std::default_delete<SigningProvider>,_true,_true>)
               this;
      }
      goto LAB_0052752f;
    }
    p_Var3 = (pLVar7->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x15];
    lVar4 = *(long *)(in_FS_OFFSET + 0x28);
joined_r0x005274db:
    if (lVar4 == lVar1) {
      (*p_Var3)(this,pLVar7,sigdata);
      return (__uniq_ptr_data<SigningProvider,_std::default_delete<SigningProvider>,_true,_true>)
             (__uniq_ptr_data<SigningProvider,_std::default_delete<SigningProvider>,_true,_true>)
             this;
    }
  }
  else {
    if (*(undefined8 **)
         ((long)cVar6.
                super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                ._M_cur + 0x30) !=
        *(undefined8 **)
         ((long)cVar6.
                super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                ._M_cur + 0x28)) {
      plVar2 = (long *)**(undefined8 **)
                         ((long)cVar6.
                                super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                                ._M_cur + 0x28);
      (**(code **)(*plVar2 + 0xb0))(plVar2,sigdata);
      if (*(long **)((long)cVar6.
                           super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                           ._M_cur + 0x30) !=
          *(long **)((long)cVar6.
                           super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                           ._M_cur + 0x28)) {
        pLVar7 = (LegacyScriptPubKeyMan *)
                 **(long **)((long)cVar6.
                                   super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                                   ._M_cur + 0x28);
        p_Var3 = (pLVar7->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x15];
        lVar4 = *(long *)(in_FS_OFFSET + 0x28);
        goto joined_r0x005274db;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
  }
LAB_0052752f:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<SigningProvider> CWallet::GetSolvingProvider(const CScript& script, SignatureData& sigdata) const
{
    // Search the cache for relevant SPKMs instead of iterating m_spk_managers
    const auto& it = m_cached_spks.find(script);
    if (it != m_cached_spks.end()) {
        // All spkms for a given script must already be able to make a SigningProvider for the script, so just return the first one.
        Assume(it->second.at(0)->CanProvide(script, sigdata));
        return it->second.at(0)->GetSolvingProvider(script);
    }

    // Legacy wallet
    LegacyScriptPubKeyMan* spkm = GetLegacyScriptPubKeyMan();
    if (spkm && spkm->CanProvide(script, sigdata)) return spkm->GetSolvingProvider(script);

    return nullptr;
}